

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildValue::BuildValue
          (BuildValue *this,Kind kind,FileInfo directoryInfo,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          values)

{
  char *pcVar1;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  StringList local_30;
  
  outputInfos.Length = 1;
  outputInfos.Data = &directoryInfo;
  BuildValue(this,kind,outputInfos,(CommandSignature)0x0);
  if ((this->kind < SuccessfulCommandWithOutputSignature) &&
     ((0x10090U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    basic::StringList::StringList<std::__cxx11::string>(&local_30,values);
    if (&this->stringValues != &local_30) {
      (this->stringValues).size = local_30.size;
      pcVar1 = (this->stringValues).contents;
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      (this->stringValues).contents = local_30.contents;
      local_30.contents = (char *)0x0;
    }
    if (local_30.contents != (char *)0x0) {
      operator_delete__(local_30.contents);
    }
    return;
  }
  __assert_fail("kindHasStringList()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                ,0xac,
                "llbuild::buildsystem::BuildValue::BuildValue(Kind, FileInfo, ArrayRef<std::string>)"
               );
}

Assistant:

BuildValue(Kind kind, FileInfo directoryInfo, ArrayRef<std::string> values)
      : BuildValue(kind, directoryInfo)
  {
    assert(kindHasStringList());

    stringValues = basic::StringList(values);
  }